

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

SurfaceInfo * Omega_h::get_surface_info(SurfaceInfo *__return_storage_ptr__,Mesh *mesh)

{
  Int IVar1;
  int ent_dim;
  Read<int> local_348;
  Read<double> local_338;
  Read<int> local_328;
  undefined1 local_318 [8];
  Reals curv_vert_curvatures;
  Read<int> local_2f8;
  Read<double> local_2e8;
  Read<int> local_2d8;
  undefined1 local_2c8 [8];
  Reals curv_edge_curvatures;
  Read<double> local_2a8;
  Read<int> local_298;
  undefined1 local_288 [8];
  Reals curv_vert_tangents;
  undefined1 local_268 [8];
  Reals curv_edge_tangents;
  Read<int> local_248;
  Read<double> local_238;
  Read<double> local_228;
  Read<int> local_218;
  undefined1 local_208 [8];
  Reals surf_vert_IIs;
  Read<int> local_1e8;
  Read<double> local_1d8;
  Read<int> local_1c8;
  undefined1 local_1b8 [8];
  Reals surf_tri_IIs;
  Read<int> local_198;
  Read<signed_char> local_188;
  Read<int> local_178;
  undefined1 local_168 [8];
  Read<signed_char> verts_are_curv;
  Read<signed_char> edges_are_curv;
  Read<double> local_138;
  Read<int> local_128;
  undefined1 local_118 [8];
  Reals surf_vert_normals;
  undefined1 local_f8 [8];
  Reals surf_side_normals;
  LOs curv_vert2vert;
  LOs curv_edge2edge;
  undefined1 local_b8 [8];
  LOs surf_vert2vert;
  undefined1 local_98 [8];
  LOs surf_side2side;
  Read<signed_char> verts_are_surf;
  Read<signed_char> sides_are_surf;
  int sdim;
  Mesh *mesh_local;
  SurfaceInfo *out;
  
  SurfaceInfo::SurfaceInfo(__return_storage_ptr__);
  IVar1 = Mesh::dim(mesh);
  if (IVar1 != 1) {
    IVar1 = Mesh::dim(mesh);
    ent_dim = IVar1 + -1;
    mark_by_class_dim((Omega_h *)&verts_are_surf.write_.shared_alloc_.direct_ptr,mesh,ent_dim,
                      ent_dim);
    mark_by_class_dim((Omega_h *)&surf_side2side.write_.shared_alloc_.direct_ptr,mesh,0,ent_dim);
    Read<signed_char>::Read
              ((Read<signed_char> *)&surf_vert2vert.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)&verts_are_surf.write_.shared_alloc_.direct_ptr);
    collect_marked((Omega_h *)local_98,
                   (Read<signed_char> *)&surf_vert2vert.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)&surf_vert2vert.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&curv_edge2edge.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)&surf_side2side.write_.shared_alloc_.direct_ptr);
    collect_marked((Omega_h *)local_b8,
                   (Read<signed_char> *)&curv_edge2edge.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)&curv_edge2edge.write_.shared_alloc_.direct_ptr);
    curv_vert2vert.write_.shared_alloc_.direct_ptr = (void *)0x0;
    curv_edge2edge.write_.shared_alloc_.alloc = (Alloc *)0x0;
    surf_side_normals.write_.shared_alloc_.direct_ptr = (void *)0x0;
    curv_vert2vert.write_.shared_alloc_.alloc = (Alloc *)0x0;
    IVar1 = Mesh::dim(mesh);
    if (IVar1 == 3) {
      Read<int>::Read((Read<int> *)&surf_vert_normals.write_.shared_alloc_.direct_ptr,
                      (Read<int> *)local_98);
      get_side_vectors((Omega_h *)local_f8,mesh,
                       (LOs *)&surf_vert_normals.write_.shared_alloc_.direct_ptr);
      Read<int>::~Read((Read<int> *)&surf_vert_normals.write_.shared_alloc_.direct_ptr);
      Read<int>::Read(&local_128,(Read<int> *)local_98);
      Read<double>::Read(&local_138,(Read<double> *)local_f8);
      Read<int>::Read((Read<int> *)&edges_are_curv.write_.shared_alloc_.direct_ptr,
                      (Read<int> *)local_b8);
      get_side_vert_normals
                ((Omega_h *)local_118,mesh,&local_128,&local_138,
                 (LOs *)&edges_are_curv.write_.shared_alloc_.direct_ptr);
      Read<int>::~Read((Read<int> *)&edges_are_curv.write_.shared_alloc_.direct_ptr);
      Read<double>::~Read(&local_138);
      Read<int>::~Read(&local_128);
      mark_by_class_dim((Omega_h *)&verts_are_curv.write_.shared_alloc_.direct_ptr,mesh,1,1);
      mark_by_class_dim((Omega_h *)local_168,mesh,0,1);
      Read<signed_char>::Read
                (&local_188,(Read<signed_char> *)&verts_are_curv.write_.shared_alloc_.direct_ptr);
      collect_marked((Omega_h *)&local_178,&local_188);
      Read<int>::operator=((Read<int> *)&curv_vert2vert.write_.shared_alloc_.direct_ptr,&local_178);
      Read<int>::~Read(&local_178);
      Read<signed_char>::~Read(&local_188);
      Read<signed_char>::Read
                ((Read<signed_char> *)&surf_tri_IIs.write_.shared_alloc_.direct_ptr,
                 (Read<signed_char> *)local_168);
      collect_marked((Omega_h *)&local_198,
                     (Read<signed_char> *)&surf_tri_IIs.write_.shared_alloc_.direct_ptr);
      Read<int>::operator=
                ((Read<int> *)&surf_side_normals.write_.shared_alloc_.direct_ptr,&local_198);
      Read<int>::~Read(&local_198);
      Read<signed_char>::~Read((Read<signed_char> *)&surf_tri_IIs.write_.shared_alloc_.direct_ptr);
      Read<int>::Read(&local_1c8,(Read<int> *)local_98);
      Read<double>::Read(&local_1d8,(Read<double> *)local_f8);
      Read<int>::Read(&local_1e8,(Read<int> *)local_b8);
      Read<double>::Read((Read<double> *)&surf_vert_IIs.write_.shared_alloc_.direct_ptr,
                         (Read<double> *)local_118);
      get_surf_tri_IIs((Omega_h *)local_1b8,mesh,&local_1c8,&local_1d8,&local_1e8,
                       (Reals *)&surf_vert_IIs.write_.shared_alloc_.direct_ptr);
      Read<double>::~Read((Read<double> *)&surf_vert_IIs.write_.shared_alloc_.direct_ptr);
      Read<int>::~Read(&local_1e8);
      Read<double>::~Read(&local_1d8);
      Read<int>::~Read(&local_1c8);
      Read<int>::Read(&local_218,(Read<int> *)local_98);
      Read<double>::Read(&local_228,(Read<double> *)local_f8);
      Read<double>::Read(&local_238,(Read<double> *)local_1b8);
      Read<int>::Read(&local_248,(Read<int> *)local_b8);
      Read<double>::Read((Read<double> *)&curv_edge_tangents.write_.shared_alloc_.direct_ptr,
                         (Read<double> *)local_118);
      get_surf_vert_IIs((Omega_h *)local_208,mesh,&local_218,&local_228,&local_238,&local_248,
                        (Reals *)&curv_edge_tangents.write_.shared_alloc_.direct_ptr);
      Read<double>::~Read((Read<double> *)&curv_edge_tangents.write_.shared_alloc_.direct_ptr);
      Read<int>::~Read(&local_248);
      Read<double>::~Read(&local_238);
      Read<double>::~Read(&local_228);
      Read<int>::~Read(&local_218);
      Read<int>::operator=(&__return_storage_ptr__->surf_vert2vert,(Read<int> *)local_b8);
      Read<double>::operator=(&__return_storage_ptr__->surf_vert_normals,(Read<double> *)local_118);
      Read<double>::operator=(&__return_storage_ptr__->surf_vert_IIs,(Read<double> *)local_208);
      Read<double>::~Read((Read<double> *)local_208);
      Read<double>::~Read((Read<double> *)local_1b8);
      Read<signed_char>::~Read((Read<signed_char> *)local_168);
      Read<signed_char>::~Read((Read<signed_char> *)&verts_are_curv.write_.shared_alloc_.direct_ptr)
      ;
      Read<double>::~Read((Read<double> *)local_118);
      Read<double>::~Read((Read<double> *)local_f8);
    }
    else {
      Read<int>::operator=
                ((Read<int> *)&curv_vert2vert.write_.shared_alloc_.direct_ptr,(Read<int> *)local_98)
      ;
      Read<int>::operator=
                ((Read<int> *)&surf_side_normals.write_.shared_alloc_.direct_ptr,
                 (Read<int> *)local_b8);
    }
    Read<int>::Read((Read<int> *)&curv_vert_tangents.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&curv_vert2vert.write_.shared_alloc_.direct_ptr);
    get_curv_edge_tangents
              ((Omega_h *)local_268,mesh,(LOs *)&curv_vert_tangents.write_.shared_alloc_.direct_ptr)
    ;
    Read<int>::~Read((Read<int> *)&curv_vert_tangents.write_.shared_alloc_.direct_ptr);
    Read<int>::Read(&local_298,(Read<int> *)&curv_vert2vert.write_.shared_alloc_.direct_ptr);
    Read<double>::Read(&local_2a8,(Read<double> *)local_268);
    Read<int>::Read((Read<int> *)&curv_edge_curvatures.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&surf_side_normals.write_.shared_alloc_.direct_ptr);
    get_curv_vert_tangents
              ((Omega_h *)local_288,mesh,&local_298,&local_2a8,
               (LOs *)&curv_edge_curvatures.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&curv_edge_curvatures.write_.shared_alloc_.direct_ptr);
    Read<double>::~Read(&local_2a8);
    Read<int>::~Read(&local_298);
    Read<int>::Read(&local_2d8,(Read<int> *)&curv_vert2vert.write_.shared_alloc_.direct_ptr);
    Read<double>::Read(&local_2e8,(Read<double> *)local_268);
    Read<int>::Read(&local_2f8,(Read<int> *)&surf_side_normals.write_.shared_alloc_.direct_ptr);
    Read<double>::Read((Read<double> *)&curv_vert_curvatures.write_.shared_alloc_.direct_ptr,
                       (Read<double> *)local_288);
    get_curv_edge_curvatures
              ((Omega_h *)local_2c8,mesh,&local_2d8,&local_2e8,&local_2f8,
               (Reals *)&curv_vert_curvatures.write_.shared_alloc_.direct_ptr);
    Read<double>::~Read((Read<double> *)&curv_vert_curvatures.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read(&local_2f8);
    Read<double>::~Read(&local_2e8);
    Read<int>::~Read(&local_2d8);
    Read<int>::Read(&local_328,(Read<int> *)&curv_vert2vert.write_.shared_alloc_.direct_ptr);
    Read<double>::Read(&local_338,(Read<double> *)local_2c8);
    Read<int>::Read(&local_348,(Read<int> *)&surf_side_normals.write_.shared_alloc_.direct_ptr);
    get_curv_vert_curvatures((Omega_h *)local_318,mesh,&local_328,&local_338,&local_348);
    Read<int>::~Read(&local_348);
    Read<double>::~Read(&local_338);
    Read<int>::~Read(&local_328);
    Read<int>::operator=
              (&__return_storage_ptr__->curv_vert2vert,
               (Read<int> *)&surf_side_normals.write_.shared_alloc_.direct_ptr);
    Read<double>::operator=(&__return_storage_ptr__->curv_vert_tangents,(Read<double> *)local_288);
    Read<double>::operator=(&__return_storage_ptr__->curv_vert_curvatures,(Read<double> *)local_318)
    ;
    Read<double>::~Read((Read<double> *)local_318);
    Read<double>::~Read((Read<double> *)local_2c8);
    Read<double>::~Read((Read<double> *)local_288);
    Read<double>::~Read((Read<double> *)local_268);
    Read<int>::~Read((Read<int> *)&surf_side_normals.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&curv_vert2vert.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)local_b8);
    Read<int>::~Read((Read<int> *)local_98);
    Read<signed_char>::~Read((Read<signed_char> *)&surf_side2side.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)&verts_are_surf.write_.shared_alloc_.direct_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

SurfaceInfo get_surface_info(Mesh* mesh) {
  SurfaceInfo out;
  if (mesh->dim() == 1) return out;
  auto sdim = mesh->dim() - 1;
  auto sides_are_surf = mark_by_class_dim(mesh, sdim, sdim);
  auto verts_are_surf = mark_by_class_dim(mesh, VERT, sdim);
  auto surf_side2side = collect_marked(sides_are_surf);
  auto surf_vert2vert = collect_marked(verts_are_surf);
  LOs curv_edge2edge;
  LOs curv_vert2vert;
  if (mesh->dim() == 3) {
    auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
    auto surf_vert_normals = get_side_vert_normals(
        mesh, surf_side2side, surf_side_normals, surf_vert2vert);
    auto edges_are_curv = mark_by_class_dim(mesh, EDGE, EDGE);
    auto verts_are_curv = mark_by_class_dim(mesh, VERT, EDGE);
    curv_edge2edge = collect_marked(edges_are_curv);
    curv_vert2vert = collect_marked(verts_are_curv);
    auto surf_tri_IIs = get_surf_tri_IIs(mesh, surf_side2side,
        surf_side_normals, surf_vert2vert, surf_vert_normals);
    auto surf_vert_IIs = get_surf_vert_IIs(mesh, surf_side2side,
        surf_side_normals, surf_tri_IIs, surf_vert2vert, surf_vert_normals);
    out.surf_vert2vert = surf_vert2vert;
    out.surf_vert_normals = surf_vert_normals;
    out.surf_vert_IIs = surf_vert_IIs;
  } else {
    curv_edge2edge = surf_side2side;
    curv_vert2vert = surf_vert2vert;
  }
  auto curv_edge_tangents = get_curv_edge_tangents(mesh, curv_edge2edge);
  auto curv_vert_tangents = get_curv_vert_tangents(
      mesh, curv_edge2edge, curv_edge_tangents, curv_vert2vert);
  auto curv_edge_curvatures = get_curv_edge_curvatures(mesh, curv_edge2edge,
      curv_edge_tangents, curv_vert2vert, curv_vert_tangents);
  auto curv_vert_curvatures = get_curv_vert_curvatures(
      mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  out.curv_vert2vert = curv_vert2vert;
  out.curv_vert_tangents = curv_vert_tangents;
  out.curv_vert_curvatures = curv_vert_curvatures;
  return out;
}